

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall mkvparser::Cues::PreloadCuePoint(Cues *this,long *cue_points_size,longlong pos)

{
  long lVar1;
  CuePoint **ppCVar2;
  CuePoint **ppCVar3;
  long lVar4;
  CuePoint *pCVar5;
  ulong uVar6;
  bool bVar7;
  
  if (this->m_count == 0) {
    lVar1 = this->m_preload_count;
    lVar4 = *cue_points_size;
    if (lVar4 <= lVar1) {
      uVar6 = 0x800;
      if (0 < lVar4) {
        uVar6 = lVar4 * 2;
      }
      ppCVar3 = (CuePoint **)
                operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8,(nothrow_t *)&std::nothrow);
      if (ppCVar3 == (CuePoint **)0x0) {
        return false;
      }
      ppCVar2 = this->m_cue_points;
      if (lVar1 != 0) {
        lVar4 = 0;
        do {
          *(undefined8 *)((long)ppCVar3 + lVar4) = *(undefined8 *)((long)ppCVar2 + lVar4);
          lVar4 = lVar4 + 8;
        } while (lVar1 << 3 != lVar4);
      }
      if (ppCVar2 != (CuePoint **)0x0) {
        operator_delete__(ppCVar2);
      }
      this->m_cue_points = ppCVar3;
      *cue_points_size = uVar6;
      if (ppCVar3 == (CuePoint **)0x0) goto LAB_001128ec;
    }
    pCVar5 = (CuePoint *)operator_new(0x30,(nothrow_t *)&std::nothrow);
    if (pCVar5 == (CuePoint *)0x0) {
      pCVar5 = (CuePoint *)0x0;
    }
    else {
      lVar1 = this->m_preload_count;
      pCVar5->m_element_start = 0;
      pCVar5->m_element_size = 0;
      pCVar5->m_index = lVar1;
      pCVar5->m_timecode = -pos;
      pCVar5->m_track_positions = (TrackPosition *)0x0;
      pCVar5->m_track_positions_count = 0;
      if (pos < 1) {
        __assert_fail("pos > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x8df,"mkvparser::CuePoint::CuePoint(long, long long)");
      }
    }
    bVar7 = pCVar5 != (CuePoint *)0x0;
    if (bVar7) {
      lVar1 = this->m_preload_count;
      this->m_preload_count = lVar1 + 1;
      this->m_cue_points[lVar1] = pCVar5;
      bVar7 = true;
    }
  }
  else {
LAB_001128ec:
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool Cues::PreloadCuePoint(long& cue_points_size, long long pos) const {
  if (m_count != 0)
    return false;

  if (m_preload_count >= cue_points_size) {
    const long n = (cue_points_size <= 0) ? 2048 : 2 * cue_points_size;

    CuePoint** const qq = new (std::nothrow) CuePoint*[n];
    if (qq == NULL)
      return false;

    CuePoint** q = qq;  // beginning of target

    CuePoint** p = m_cue_points;  // beginning of source
    CuePoint** const pp = p + m_preload_count;  // end of source

    while (p != pp)
      *q++ = *p++;

    delete[] m_cue_points;

    m_cue_points = qq;
    cue_points_size = n;
  }

  CuePoint* const pCP = new (std::nothrow) CuePoint(m_preload_count, pos);
  if (pCP == NULL)
    return false;

  m_cue_points[m_preload_count++] = pCP;
  return true;
}